

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O0

int copy_issuer(X509V3_CTX *ctx,GENERAL_NAMES *gens)

{
  int loc;
  X509_EXTENSION *ext_00;
  GENERAL_NAME *pGVar1;
  size_t sVar2;
  GENERAL_NAME *gen;
  size_t j;
  X509_EXTENSION *ext;
  GENERAL_NAMES *ialt;
  int ret;
  int i;
  GENERAL_NAMES *gens_local;
  X509V3_CTX *ctx_local;
  
  if ((ctx == (X509V3_CTX *)0x0) || (ctx->flags != 1)) {
    if ((ctx == (X509V3_CTX *)0x0) || (ctx->issuer_cert == (X509 *)0x0)) {
      ERR_put_error(0x14,0,0x8d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                    ,0x108);
      ctx_local._4_4_ = 0;
    }
    else {
      loc = X509_get_ext_by_NID((X509 *)ctx->issuer_cert,0x55,-1);
      if (loc < 0) {
        ctx_local._4_4_ = 1;
      }
      else {
        ialt._0_4_ = 0;
        ext = (X509_EXTENSION *)0x0;
        ext_00 = X509_get_ext((X509 *)ctx->issuer_cert,loc);
        if ((ext_00 == (X509_EXTENSION *)0x0) ||
           (ext = (X509_EXTENSION *)X509V3_EXT_d2i(ext_00), ext == (X509_EXTENSION *)0x0)) {
          ERR_put_error(0x14,0,0x88,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                        ,0x115);
        }
        else {
          for (gen = (GENERAL_NAME *)0x0;
              pGVar1 = (GENERAL_NAME *)sk_GENERAL_NAME_num((stack_st_GENERAL_NAME *)ext),
              gen < pGVar1; gen = (GENERAL_NAME *)((long)&gen->type + 1)) {
            pGVar1 = sk_GENERAL_NAME_value((stack_st_GENERAL_NAME *)ext,(size_t)gen);
            sVar2 = sk_GENERAL_NAME_push(gens,pGVar1);
            if (sVar2 == 0) goto LAB_002f57b1;
            sk_GENERAL_NAME_set((stack_st_GENERAL_NAME *)ext,(size_t)gen,(GENERAL_NAME *)0x0);
          }
          ialt._0_4_ = 1;
        }
LAB_002f57b1:
        GENERAL_NAMES_free((GENERAL_NAMES *)ext);
        ctx_local._4_4_ = (int)ialt;
      }
    }
  }
  else {
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

static int copy_issuer(const X509V3_CTX *ctx, GENERAL_NAMES *gens) {
  if (ctx && (ctx->flags == X509V3_CTX_TEST)) {
    return 1;
  }
  if (!ctx || !ctx->issuer_cert) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_NO_ISSUER_DETAILS);
    return 0;
  }
  int i = X509_get_ext_by_NID(ctx->issuer_cert, NID_subject_alt_name, -1);
  if (i < 0) {
    return 1;
  }

  int ret = 0;
  GENERAL_NAMES *ialt = NULL;
  X509_EXTENSION *ext;
  if (!(ext = X509_get_ext(ctx->issuer_cert, i)) ||
      !(ialt = reinterpret_cast<GENERAL_NAMES *>(X509V3_EXT_d2i(ext)))) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_ISSUER_DECODE_ERROR);
    goto err;
  }

  for (size_t j = 0; j < sk_GENERAL_NAME_num(ialt); j++) {
    GENERAL_NAME *gen = sk_GENERAL_NAME_value(ialt, j);
    if (!sk_GENERAL_NAME_push(gens, gen)) {
      goto err;
    }
    // Ownership of |gen| has moved from |ialt| to |gens|.
    sk_GENERAL_NAME_set(ialt, j, NULL);
  }

  ret = 1;

err:
  GENERAL_NAMES_free(ialt);
  return ret;
}